

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dSFMT.c
# Opt level: O0

void period_certification(dsfmt_t *dsfmt)

{
  int local_44;
  ulong uStack_40;
  int i;
  uint64_t inner;
  uint64_t tmp [2];
  uint64_t pcv [2];
  dsfmt_t *dsfmt_local;
  
  uStack_40 = *(ulong *)((long)dsfmt->status + 0xbf8) & 1 ^
              (dsfmt->status[0xbf].u[0] ^ 0x90014964b32f4329) & 0x3d84e1ac0dc82880;
  for (local_44 = 0x20; local_44 != 0; local_44 = local_44 >> 1) {
    uStack_40 = uStack_40 >> (sbyte)local_44 ^ uStack_40;
  }
  if ((uStack_40 & 1) != 1) {
    *(ulong *)((long)dsfmt->status + 0xbf8) = *(ulong *)((long)dsfmt->status + 0xbf8) ^ 1;
  }
  return;
}

Assistant:

static void period_certification(dsfmt_t* dsfmt)
{
	uint64_t pcv[2] = {DSFMT_PCV1, DSFMT_PCV2};
	uint64_t tmp[2];
	uint64_t inner;
	int i;
#if (DSFMT_PCV2 & 1) != 1
    int j;
    uint64_t work;
#endif

	tmp[0] = (dsfmt->status[DSFMT_N].u[0] ^ DSFMT_FIX1);
	tmp[1] = (dsfmt->status[DSFMT_N].u[1] ^ DSFMT_FIX2);

	inner = tmp[0] & pcv[0];
	inner ^= tmp[1] & pcv[1];
	for (i = 32; i > 0; i >>= 1)
	{
		inner ^= inner >> i;
	}
	inner &= 1;
	/* check OK */
	if (inner == 1)
	{
		return;
	}
	/* check NG, and modification */
#if (DSFMT_PCV2 & 1) == 1
	dsfmt->status[DSFMT_N].u[1] ^= 1;
#else
    for (i = 1; i >= 0; i--) {
	work = 1;
	for (j = 0; j < 64; j++) {
	    if ((work & pcv[i]) != 0) {
		dsfmt->status[DSFMT_N].u[i] ^= work;
		return;
	    }
	    work = work << 1;
	}
    }
#endif
}